

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

basic_appender<char>
fmt::v11::detail::fill<char,fmt::v11::basic_appender<char>>
          (basic_appender<char> it,size_t n,basic_specs *specs)

{
  uint uVar1;
  char *data;
  bool bVar2;
  char local_21;
  
  uVar1 = specs->data_ >> 0xf & 7;
  if (uVar1 == 1) {
    it = fill_n<fmt::v11::basic_appender<char>,unsigned_long,char>(it,n,&local_21);
  }
  else {
    while (bVar2 = n != 0, n = n - 1, bVar2) {
      buffer<char>::append<char>(it.container,specs->fill_data_,specs->fill_data_ + uVar1);
    }
  }
  return (basic_appender<char>)it.container;
}

Assistant:

FMT_NOINLINE FMT_CONSTEXPR auto fill(OutputIt it, size_t n,
                                     const basic_specs& specs) -> OutputIt {
  auto fill_size = specs.fill_size();
  if (fill_size == 1) return detail::fill_n(it, n, specs.fill_unit<Char>());
  if (const Char* data = specs.fill<Char>()) {
    for (size_t i = 0; i < n; ++i) it = copy<Char>(data, data + fill_size, it);
  }
  return it;
}